

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers_for_testing.hpp
# Opt level: O2

void HelpersForTests::noise_bitstring_inplace<bool,6144ul>
               (array<bool,_6144UL> *src,double err_prob,uint seed)

{
  size_t i;
  long lVar1;
  double dVar2;
  mt19937_64 rng;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  local_9e0;
  
  std::
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  ::seed(&local_9e0,(ulong)seed);
  for (lVar1 = 0; lVar1 != 0x1800; lVar1 = lVar1 + 1) {
    dVar2 = std::
            generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                      (&local_9e0);
    if (dVar2 < err_prob) {
      src->_M_elems[lVar1] = (bool)(src->_M_elems[lVar1] ^ 1);
    }
  }
  return;
}

Assistant:

void noise_bitstring_inplace(std::array<T, N> &src, double err_prob, unsigned int seed = 0) {
        std::mt19937_64 rng{seed}; // hard-coded seed for testing purposes.

        std::bernoulli_distribution distribution(err_prob);

        for (std::size_t i = 0; i < src.size(); i++) {
            if (distribution(rng)) {
                src[i] = !src[i];
            } else {
                src[i] = src[i];
            }
        }
    }